

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O0

bool __thiscall kws::Generator::GenerateHTML(Generator *this,char *dir,bool showAllErrors)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  ulong uVar4;
  char *pcVar5;
  reference pPVar6;
  long lVar7;
  reference pEVar8;
  reference ppVar9;
  reference ppVar10;
  reference plVar11;
  ostream *poVar12;
  byte in_DL;
  char *in_RSI;
  long in_RDI;
  long space;
  long sup;
  long inf;
  long p;
  int k_1;
  uint k;
  string l;
  const_iterator err;
  const_iterator errorLineIt_1;
  string errorTag;
  long error;
  unsigned_long nLines;
  bool comment;
  iterator errorLineIt;
  ErrorLineType errLine;
  unsigned_long index;
  const_iterator itError;
  ErrorVectorType errors;
  vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
  errorLines;
  uint i;
  long slash;
  long pos_1;
  long pos;
  string filename2;
  string filename;
  ofstream file;
  undefined1 in_stack_0000075f;
  char *in_stack_00000760;
  Generator *in_stack_00000768;
  const_iterator it;
  string imageKWStyleLogo;
  string imageProjectLogo;
  string imagedir;
  Directory directory;
  Parser *in_stack_fffffffffffff638;
  undefined4 in_stack_fffffffffffff640;
  int in_stack_fffffffffffff644;
  value_type *in_stack_fffffffffffff648;
  Parser *in_stack_fffffffffffff650;
  string *in_stack_fffffffffffff658;
  string *in_stack_fffffffffffff670;
  Parser *in_stack_fffffffffffff678;
  mode_t *in_stack_fffffffffffff680;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffff690;
  Parser *in_stack_fffffffffffff698;
  string *in_stack_fffffffffffff6c8;
  string *in_stack_fffffffffffff6d0;
  Directory *in_stack_fffffffffffff6d8;
  ostream *in_stack_fffffffffffff6f8;
  Generator *in_stack_fffffffffffff700;
  allocator *in_stack_fffffffffffff800;
  ostream *in_stack_fffffffffffff808;
  Generator *in_stack_fffffffffffff810;
  char *local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  int local_6d8;
  string local_6d0 [32];
  pair<long,_std::vector<long,_std::allocator<long>_>_> *local_6b0;
  long *local_6a8;
  string local_6a0 [32];
  string local_680 [32];
  char *in_stack_fffffffffffff9a0;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
  in_stack_fffffffffffff9a8;
  __normal_iterator<const_std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
  local_640;
  allocator local_631;
  string local_630 [32];
  long local_610;
  ulong local_608;
  byte local_5f9;
  ErrorStruct *local_5f8;
  unsigned_long local_5f0;
  unsigned_long local_5e8;
  pair<long,_std::vector<long,_std::allocator<long>_>_> *local_5e0;
  pair<long,_std::vector<long,_std::allocator<long>_>_> *local_5d8;
  pair<long,_std::vector<long,_std::allocator<long>_>_> *local_5d0;
  __normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
  local_5c8;
  ulong local_5c0;
  ulong local_5a0;
  ErrorStruct *local_598;
  __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
  local_590 [7];
  string local_558 [36];
  uint local_534;
  ulong local_530;
  string local_528 [32];
  ulong local_508;
  string local_500 [32];
  ulong local_4e0;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [36];
  int local_48c;
  Parser *local_488;
  string local_480 [32];
  ostream local_460 [512];
  Parser *local_260;
  Parser *local_258;
  Parser *local_250;
  __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
  local_248;
  CopyStatus local_240;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  CopyStatus local_1e0;
  undefined1 local_1d1 [33];
  string local_1b0 [32];
  string local_190 [32];
  CopyStatus local_170;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  CopyStatus local_110;
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [36];
  Status local_9c;
  allocator local_91;
  string local_90 [36];
  Status local_6c;
  allocator local_51;
  string local_50 [32];
  Status local_30;
  byte local_19;
  char *local_18;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  kwssys::Directory::Directory
            ((Directory *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  pcVar5 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar5,&local_51);
  local_30 = kwssys::Directory::Load
                       (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
                        in_stack_fffffffffffff6c8);
  bVar1 = kwssys::Status::operator_cast_to_bool((Status *)0x18faa3);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar12 = std::operator<<((ostream *)&std::cout,"Creating HTML directory: ");
    poVar12 = std::operator<<(poVar12,local_18);
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    local_6c = kwssys::SystemTools::MakeDirectory
                         ((char *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
                          in_stack_fffffffffffff680);
    bVar1 = kwssys::Status::operator_cast_to_bool((Status *)0x18fb70);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar12 = std::operator<<((ostream *)&std::cout,"Cannot create HTML directory: ");
      poVar12 = std::operator<<(poVar12,local_18);
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    }
  }
  pcVar5 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar5,&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::operator+=(local_90,"/images");
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    std::__cxx11::string::c_str();
    local_9c = kwssys::SystemTools::MakeDirectory
                         ((char *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
                          in_stack_fffffffffffff680);
    bVar1 = kwssys::Status::operator_cast_to_bool((Status *)0x18fd1a);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar12 = std::operator<<((ostream *)&std::cout,"Cannot create images directory: ");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar12 = std::operator<<(poVar12,pcVar5);
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string(local_c0,local_90);
    std::__cxx11::string::operator+=(local_c0,"/");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,pcVar5,&local_101);
    kwssys::SystemTools::GetFilenameName(in_stack_fffffffffffff658);
    std::__cxx11::string::operator+=(local_c0,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,pcVar5,&local_131);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,pcVar5,&local_159);
    local_170 = kwssys::SystemTools::CopyFileIfDifferent
                          (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    local_110 = local_170;
    bVar1 = kwssys::Status::operator_cast_to_bool((Status *)0x18ffbf);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar12 = std::operator<<((ostream *)&std::cout,"Cannot copy the project logo file: ");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar12 = std::operator<<(poVar12,pcVar5);
      poVar12 = std::operator<<(poVar12," into ");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar12 = std::operator<<(poVar12,pcVar5);
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string(local_c0);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string(local_190,local_90);
    std::__cxx11::string::operator+=(local_190,"/");
    in_stack_fffffffffffff808 = (ostream *)std::__cxx11::string::c_str();
    in_stack_fffffffffffff810 = (Generator *)local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1d1 + 1),(char *)in_stack_fffffffffffff808,
               (allocator *)in_stack_fffffffffffff810);
    kwssys::SystemTools::GetFilenameName(in_stack_fffffffffffff658);
    std::__cxx11::string::operator+=(local_190,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string((string *)(local_1d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    in_stack_fffffffffffff800 = &local_201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,pcVar5,in_stack_fffffffffffff800);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,pcVar5,&local_229);
    local_240 = kwssys::SystemTools::CopyFileIfDifferent
                          (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    local_1e0 = local_240;
    bVar1 = kwssys::Status::operator_cast_to_bool((Status *)0x1903cd);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar12 = std::operator<<((ostream *)&std::cout,"Cannot copy the KWStyle logo file: ");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar12 = std::operator<<(poVar12,pcVar5);
      poVar12 = std::operator<<(poVar12," into ");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      poVar12 = std::operator<<(poVar12,pcVar5);
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string(local_190);
  }
  GenerateMatrix(in_stack_00000768,in_stack_00000760,(bool)in_stack_0000075f);
  GenerateDescription((Generator *)in_stack_fffffffffffff9a8._M_current,in_stack_fffffffffffff9a0);
  std::operator<<((ostream *)&std::cout,"Generating HTML...");
  local_250 = (Parser *)
              std::vector<kws::Parser,_std::allocator<kws::Parser>_>::begin
                        ((vector<kws::Parser,_std::allocator<kws::Parser>_> *)
                         in_stack_fffffffffffff638);
  __gnu_cxx::
  __normal_iterator<kws::Parser_const*,std::vector<kws::Parser,std::allocator<kws::Parser>>>::
  __normal_iterator<kws::Parser*>
            ((__normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
              *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (__normal_iterator<kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
              *)in_stack_fffffffffffff638);
LAB_00190669:
  do {
    local_258 = (Parser *)
                std::vector<kws::Parser,_std::allocator<kws::Parser>_>::end
                          ((vector<kws::Parser,_std::allocator<kws::Parser>_> *)
                           in_stack_fffffffffffff638);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                        *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                       (__normal_iterator<kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                        *)in_stack_fffffffffffff638);
    if (!bVar1) {
      poVar12 = std::operator<<((ostream *)&std::cout,"done");
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      local_1 = 1;
      local_48c = 1;
      goto LAB_00191be2;
    }
    if ((local_19 & 1) == 0) {
      pPVar6 = __gnu_cxx::
               __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
               ::operator*(&local_248);
      Parser::GetErrors(pPVar6);
      bVar1 = std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::empty
                        (&in_stack_fffffffffffff650->m_ErrorList);
      if (bVar1) {
        local_260 = (Parser *)
                    __gnu_cxx::
                    __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                    ::operator++((__normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                                  *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
        goto LAB_00190669;
      }
    }
    std::ofstream::ofstream(local_460);
    __gnu_cxx::
    __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
    ::operator*(&local_248);
    Parser::GetFilename_abi_cxx11_(in_stack_fffffffffffff638);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_480);
    pcVar5 = local_18;
    if ((bVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b0,pcVar5,&local_4b1);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
      std::__cxx11::string::operator+=(local_4b0,"/");
      __gnu_cxx::
      __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
      ::operator*(&local_248);
      Parser::GetFilename_abi_cxx11_(in_stack_fffffffffffff638);
      lVar7 = std::__cxx11::string::find((char *)local_4d8,0x1e6eea);
      local_4e0 = (ulong)(lVar7 != -1);
      if (local_4e0 != 0) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_500,(ulong)local_4d8);
        std::__cxx11::string::operator=(local_4d8,local_500);
        std::__cxx11::string::~string(local_500);
      }
      lVar7 = std::__cxx11::string::find((char *)local_4d8,0x1e4bcc);
      local_508 = (ulong)(lVar7 != -1);
      if (local_508 != 0) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_528,(ulong)local_4d8);
        std::__cxx11::string::operator=(local_4d8,local_528);
        std::__cxx11::string::~string(local_528);
      }
      local_530 = std::__cxx11::string::find_last_of((char *)local_4d8,0x1d8c59);
      local_534 = 0;
      while( true ) {
        bVar1 = false;
        if (local_530 != 0xffffffffffffffff) {
          bVar1 = local_534 < *(uint *)(in_RDI + 0x68);
        }
        if (!bVar1) break;
        std::__cxx11::string::replace((ulong)local_4d8,local_530,(char *)0x1);
        local_530 = std::__cxx11::string::find_last_of((char *)local_4d8,0x1d8c59);
        local_534 = local_534 + 1;
      }
      local_530 = std::__cxx11::string::find_last_of((char *)local_4d8,0x1d8c59);
      if (local_530 != -1) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_558,(ulong)local_4d8);
        std::__cxx11::string::operator=(local_4d8,local_558);
        std::__cxx11::string::~string(local_558);
      }
      std::__cxx11::string::operator+=(local_4b0,local_4d8);
      std::__cxx11::string::operator+=(local_4b0,".html");
      _Var3 = std::__cxx11::string::c_str();
      std::operator|(_S_bin,_S_out);
      std::ofstream::open((char *)local_460,_Var3);
      bVar2 = std::ofstream::is_open();
      if ((bVar2 & 1) == 0) {
        poVar12 = std::operator<<((ostream *)&std::cout,"Cannot open file for writing: ");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
        local_48c = 1;
      }
      else {
        std::__cxx11::string::c_str();
        CreateHeader(in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                     (char *)in_stack_fffffffffffff800);
        poVar12 = std::operator<<(local_460,"<table width=\"100%\" border=\"0\" height=\"1\">");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        std::
        vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
        ::vector((vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                  *)0x190c97);
        pPVar6 = __gnu_cxx::
                 __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                 ::operator*(&local_248);
        Parser::GetErrors(pPVar6);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::vector
                  (in_stack_fffffffffffff690,
                   (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                   CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
        local_590[0]._M_current =
             (ErrorStruct *)
             std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::begin
                       (&in_stack_fffffffffffff638->m_ErrorList);
        while( true ) {
          local_598 = (ErrorStruct *)
                      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::end
                                (&in_stack_fffffffffffff638->m_ErrorList);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                              *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                             (__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                              *)in_stack_fffffffffffff638);
          if (!bVar1) break;
          pEVar8 = __gnu_cxx::
                   __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                   ::operator*(local_590);
          local_5a0 = pEVar8->line;
          while( true ) {
            uVar4 = local_5a0;
            pEVar8 = __gnu_cxx::
                     __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                     ::operator*(local_590);
            if (pEVar8->line2 < uVar4) break;
            std::pair<long,_std::vector<long,_std::allocator<long>_>_>::
            pair<long,_std::vector<long,_std::allocator<long>_>,_true>
                      ((pair<long,_std::vector<long,_std::allocator<long>_>_> *)
                       CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
            local_5c0 = local_5a0;
            local_5c8._M_current =
                 (pair<long,_std::vector<long,_std::allocator<long>_>_> *)
                 std::
                 vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                 ::begin((vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                          *)in_stack_fffffffffffff638);
            while( true ) {
              local_5d0 = (pair<long,_std::vector<long,_std::allocator<long>_>_> *)
                          std::
                          vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                          ::end((vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                                 *)in_stack_fffffffffffff638);
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                                 (__normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                                  *)in_stack_fffffffffffff638);
              if (!bVar1) break;
              ppVar9 = __gnu_cxx::
                       __normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                       ::operator*(&local_5c8);
              if (ppVar9->first == (long)(int)local_5a0) break;
              local_5d8 = (pair<long,_std::vector<long,_std::allocator<long>_>_> *)
                          __gnu_cxx::
                          __normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                          ::operator++((__normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                                        *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
            }
            local_5e0 = (pair<long,_std::vector<long,_std::allocator<long>_>_> *)
                        std::
                        vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                        ::end((vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                               *)in_stack_fffffffffffff638);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                               (__normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                                *)in_stack_fffffffffffff638);
            if (bVar1) {
              __gnu_cxx::
              __normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
              ::operator*(&local_5c8);
              pEVar8 = __gnu_cxx::
                       __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                       ::operator*(local_590);
              local_5e8 = pEVar8->number;
              std::vector<long,_std::allocator<long>_>::push_back
                        ((vector<long,_std::allocator<long>_> *)
                         CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         (value_type_conflict4 *)in_stack_fffffffffffff638);
            }
            else {
              pEVar8 = __gnu_cxx::
                       __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                       ::operator*(local_590);
              local_5f0 = pEVar8->number;
              std::vector<long,_std::allocator<long>_>::push_back
                        ((vector<long,_std::allocator<long>_> *)
                         CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                         (value_type_conflict4 *)in_stack_fffffffffffff638);
              std::
              vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
              ::push_back((vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                           *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
            }
            std::pair<long,_std::vector<long,_std::allocator<long>_>_>::~pair
                      ((pair<long,_std::vector<long,_std::allocator<long>_>_> *)0x190f3a);
            local_5a0 = local_5a0 + 1;
          }
          local_5f8 = (ErrorStruct *)
                      __gnu_cxx::
                      __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                      ::operator++((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                                    *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
        }
        local_5f9 = 0;
        __gnu_cxx::
        __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
        ::operator*(&local_248);
        local_608 = Parser::GetNumberOfLines(in_stack_fffffffffffff650);
        for (local_534 = 0; local_534 < local_608; local_534 = local_534 + 1) {
          local_610 = -1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_630,"",&local_631);
          std::allocator<char>::~allocator((allocator<char> *)&local_631);
          std::
          vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
          ::begin((vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                   *)in_stack_fffffffffffff638);
          __gnu_cxx::
          __normal_iterator<std::pair<long,std::vector<long,std::allocator<long>>>const*,std::vector<std::pair<long,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long,std::vector<long,std::allocator<long>>>>>>
          ::__normal_iterator<std::pair<long,std::vector<long,std::allocator<long>>>*>
                    ((__normal_iterator<const_std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     (__normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                      *)in_stack_fffffffffffff638);
          while( true ) {
            std::
            vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ::end((vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                   *)in_stack_fffffffffffff638);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                               (__normal_iterator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                                *)in_stack_fffffffffffff638);
            if (!bVar1) goto LAB_0019129b;
            ppVar10 = __gnu_cxx::
                      __normal_iterator<const_std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                      ::operator*(&local_640);
            if (ppVar10->first == (long)(int)(local_534 + 1)) break;
            local_6b0 = (pair<long,_std::vector<long,_std::allocator<long>_>_> *)
                        __gnu_cxx::
                        __normal_iterator<const_std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                        ::operator++((__normal_iterator<const_std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
                                      *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
          ::operator*(&local_640);
          std::vector<long,_std::allocator<long>_>::begin
                    ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff638);
          while( true ) {
            __gnu_cxx::
            __normal_iterator<const_std::pair<long,_std::vector<long,_std::allocator<long>_>_>_*,_std::vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>_>
            ::operator*(&local_640);
            std::vector<long,_std::allocator<long>_>::end
                      ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff638);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)in_stack_fffffffffffff638);
            if (!bVar1) break;
            plVar11 = __gnu_cxx::
                      __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator*((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                 *)&stack0xfffffffffffff9a8);
            local_610 = *plVar11;
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::__cxx11::string::operator+=(local_630,",");
              __gnu_cxx::
              __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
              ::operator*(&local_248);
              Parser::GetErrorTag_abi_cxx11_
                        (in_stack_fffffffffffff678,(unsigned_long)in_stack_fffffffffffff670);
              std::__cxx11::string::operator+=(local_630,local_6a0);
              std::__cxx11::string::~string(local_6a0);
            }
            else {
              __gnu_cxx::
              __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
              ::operator*(&local_248);
              Parser::GetErrorTag_abi_cxx11_
                        (in_stack_fffffffffffff678,(unsigned_long)in_stack_fffffffffffff670);
              std::__cxx11::string::operator+=(local_630,local_680);
              std::__cxx11::string::~string(local_680);
            }
            local_6a8 = (long *)__gnu_cxx::
                                __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                ::operator++((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                              *)in_stack_fffffffffffff648,in_stack_fffffffffffff644)
            ;
          }
LAB_0019129b:
          if (local_610 < 0) {
            poVar12 = std::operator<<(local_460,"<tr>");
            std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          }
          else {
            in_stack_fffffffffffff700 = (Generator *)std::operator<<(local_460,"<tr bgcolor=\"");
            in_stack_fffffffffffff6f8 =
                 std::operator<<((ostream *)in_stack_fffffffffffff700,ErrorColor + local_610 * 8);
            poVar12 = std::operator<<(in_stack_fffffffffffff6f8,"\">");
            std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          }
          poVar12 = std::operator<<(local_460,"<td height=\"1\">");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_534 + 1);
          poVar12 = std::operator<<(poVar12,"</td>");
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          poVar12 = std::operator<<(local_460,"<td height=\"1\">");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          poVar12 = std::operator<<(poVar12,pcVar5);
          poVar12 = std::operator<<(poVar12,"</td>");
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          __gnu_cxx::
          __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
          ::operator*(&local_248);
          Parser::GetLine_abi_cxx11_
                    (in_stack_fffffffffffff698,(unsigned_long)in_stack_fffffffffffff690);
          lVar7 = std::__cxx11::string::find((char *)local_630,0x1e4da4);
          if (lVar7 != -1) {
            while( true ) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_6d0);
              bVar1 = true;
              if (*pcVar5 != ' ') {
                pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_6d0);
                bVar1 = *pcVar5 == '\n';
              }
              if (!bVar1) break;
              in_stack_fffffffffffff698 =
                   (Parser *)std::__cxx11::string::operator[]((ulong)local_6d0);
              if (*(char *)&(in_stack_fffffffffffff698->m_ErrorList).
                            super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                            _M_impl.super__Vector_impl_data._M_start == ' ') {
                in_stack_fffffffffffff690 =
                     (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                     std::__cxx11::string::operator[]((ulong)local_6d0);
                *(undefined1 *)
                 &(in_stack_fffffffffffff690->
                  super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>)._M_impl.
                  super__Vector_impl_data._M_start = 0x2a;
              }
            }
          }
          lVar7 = std::__cxx11::string::find((char *)local_630,0x1e4da8);
          if (lVar7 != -1) {
            local_6d8 = std::__cxx11::string::size();
            while( true ) {
              local_6d8 = local_6d8 + -1;
              bVar1 = false;
              if (0 < local_6d8) {
                pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_6d0);
                bVar1 = *pcVar5 == ' ';
              }
              if (!bVar1) break;
              in_stack_fffffffffffff678 =
                   (Parser *)std::__cxx11::string::operator[]((ulong)local_6d0);
              *(undefined1 *)
               &(in_stack_fffffffffffff678->m_ErrorList).
                super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                super__Vector_impl_data._M_start = 0x2a;
            }
            in_stack_fffffffffffff68f = 0;
          }
          uVar4 = std::__cxx11::string::find((char)local_6d0,10);
          if (uVar4 != 0xffffffffffffffff) {
            std::__cxx11::string::replace((ulong)local_6d0,uVar4,(char *)0x1);
          }
          local_6e8 = std::__cxx11::string::find((char *)local_6d0,0x1e5c08);
          while (local_6e8 != 0xffffffffffffffff) {
            std::__cxx11::string::replace((ulong)local_6d0,local_6e8,(char *)0x1);
            local_6e8 = std::__cxx11::string::find((char *)local_6d0,0x1e5c08);
          }
          local_6f0 = std::__cxx11::string::find((char *)local_6d0,0x1e512a);
          while (local_6f0 != 0xffffffffffffffff) {
            std::__cxx11::string::replace((ulong)local_6d0,local_6f0,(char *)0x1);
            local_6f0 = std::__cxx11::string::find((char *)local_6d0,0x1e512a);
          }
          local_6f8 = (char *)std::__cxx11::string::find((char)local_6d0,0x20);
          while (local_6f8 != (char *)0xffffffffffffffff) {
            std::__cxx11::string::replace((ulong)local_6d0,(ulong)local_6f8,(char *)0x1);
            local_6f8 = (char *)std::__cxx11::string::find((char)local_6d0,0x20);
          }
          if ((local_5f9 & 1) != 0) {
            std::__cxx11::string::insert((ulong)local_6d0,(char *)0x0);
          }
          pcVar5 = (char *)std::__cxx11::string::find((char *)local_6d0,0x1d8c52);
          if (pcVar5 == (char *)0xffffffffffffffff) {
            local_6f8 = (char *)std::__cxx11::string::find((char *)local_6d0,0x1d8c55);
            while (local_6f8 != (char *)0xffffffffffffffff) {
              local_5f9 = 1;
              std::__cxx11::string::insert((ulong)local_6d0,local_6f8);
              local_6f8 = (char *)std::__cxx11::string::find((char *)local_6d0,0x1d8c55);
            }
            if ((local_5f9 & 1) != 0) {
              in_stack_fffffffffffff670 = local_6d0;
              pcVar5 = (char *)std::__cxx11::string::size();
              std::__cxx11::string::insert((ulong)in_stack_fffffffffffff670,pcVar5);
            }
            local_6f8 = (char *)std::__cxx11::string::find((char *)local_6d0,0x1d8c58);
            while (local_6f8 != (char *)0xffffffffffffffff) {
              local_5f9 = 0;
              std::__cxx11::string::insert((ulong)local_6d0,(char *)((long)local_6f8 + 2));
              local_6f8 = (char *)std::__cxx11::string::find((char *)local_6d0,0x1d8c58);
            }
          }
          else {
            std::__cxx11::string::insert((ulong)local_6d0,pcVar5);
            std::__cxx11::string::operator+=(local_6d0,"<font>");
          }
          poVar12 = std::operator<<(local_460,
                                    "<td height=\"1\"><font face=\"Courier New, Courier, mono\" size=\"2\">"
                                   );
          pcVar5 = (char *)std::__cxx11::string::c_str();
          poVar12 = std::operator<<(poVar12,pcVar5);
          poVar12 = std::operator<<(poVar12,"</font></td>");
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          in_stack_fffffffffffff650 = (Parser *)std::operator<<(local_460,"</tr>");
          std::ostream::operator<<(in_stack_fffffffffffff650,std::endl<char,std::char_traits<char>>)
          ;
          std::__cxx11::string::~string(local_6d0);
          std::__cxx11::string::~string(local_630);
        }
        in_stack_fffffffffffff648 = (value_type *)std::operator<<(local_460,"</table>");
        std::ostream::operator<<(in_stack_fffffffffffff648,std::endl<char,std::char_traits<char>>);
        CreateFooter(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
        std::ofstream::close();
        __gnu_cxx::
        __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
        ::operator++((__normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                      *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector
                  (&in_stack_fffffffffffff650->m_ErrorList);
        std::
        vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
        ::~vector((vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                   *)in_stack_fffffffffffff650);
        local_48c = 0;
      }
      std::__cxx11::string::~string(local_4d8);
      std::__cxx11::string::~string(local_4b0);
    }
    else {
      local_488 = (Parser *)
                  __gnu_cxx::
                  __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                  ::operator++((__normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                                *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
      local_48c = 2;
    }
    std::ofstream::~ofstream(local_460);
    in_stack_fffffffffffff644 = local_48c;
    if ((local_48c != 0) && (local_48c != 2)) {
LAB_00191be2:
      std::__cxx11::string::~string(local_90);
      kwssys::Directory::~Directory
                ((Directory *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      return (bool)(local_1 & 1);
    }
  } while( true );
}

Assistant:

bool Generator::GenerateHTML(const char* dir,bool showAllErrors)
{
  // Check if the directory exists. If not create it
  kwssys::Directory directory;
  if(!directory.Load(dir))
    {
    std::cout << "Creating HTML directory: " << dir << std::endl;
    if(!kwssys::SystemTools::MakeDirectory(dir))
      {
      std::cout << "Cannot create HTML directory: " << dir << std::endl;
      }
    }

  std::string imagedir = dir;
  imagedir += "/images";

  // Copy the m_ProjectLogo and m_KWStyleLogo to the images directory
  if (!m_ProjectLogo.empty() || !m_KWStyleLogo.empty()) {
    if(!kwssys::SystemTools::MakeDirectory(imagedir.c_str()))
      {
      std::cout << "Cannot create images directory: "
                << imagedir.c_str() << std::endl;
      }
  }

  if (!m_ProjectLogo.empty()) {
    std::string imageProjectLogo = imagedir;
    imageProjectLogo += "/";
    imageProjectLogo += kwssys::SystemTools::GetFilenameName(m_ProjectLogo.c_str());
    if(!kwssys::SystemTools::CopyFileIfDifferent(m_ProjectLogo.c_str(),imageProjectLogo.c_str()))
      {
      std::cout << "Cannot copy the project logo file: "
                << m_ProjectLogo.c_str() << " into "
                << imageProjectLogo.c_str() << std::endl;
      }
  }

  if (!m_KWStyleLogo.empty()) {
    std::string imageKWStyleLogo = imagedir;
    imageKWStyleLogo += "/";
    imageKWStyleLogo += kwssys::SystemTools::GetFilenameName(m_KWStyleLogo.c_str());
    if(!kwssys::SystemTools::CopyFileIfDifferent(m_KWStyleLogo.c_str(),imageKWStyleLogo.c_str()))
      {
      std::cout << "Cannot copy the KWStyle logo file: "
                << m_KWStyleLogo.c_str() << " into "
                << imageKWStyleLogo.c_str() << std::endl;
      }
  }

  // Generate the matrix representation
  this->GenerateMatrix(dir,showAllErrors);
  this->GenerateDescription(dir);

  std::cout << "Generating HTML...";

  // For each file we generate an html page
  ParserVectorType::const_iterator it = m_Parsers->begin();
  while(it != m_Parsers->end())
    {
    if (!showAllErrors && (*it).GetErrors().empty()) {
      it++;
      continue;
    }

    std::ofstream file;

    if ((*it).GetFilename().empty()) {
      it++;
      continue;
    }

    // Extract the filename
    // Replace '/' by '_'
    std::string filename = dir;
    filename += "/";
    std::string filename2 = (*it).GetFilename();
    if(long int pos = filename2.find(":/") != std::string::npos)
      {
      filename2 = filename2.substr(pos+2,filename2.size()-pos-2);
      }
    if(long int pos = filename2.find(":\\") != std::string::npos)
      {
      filename2 = filename2.substr(pos+2,filename2.size()-pos-2);
      }

      auto slash = static_cast<long int>(filename2.find_last_of("/"));
      unsigned int i = 0;
      while (slash != -1 && i < m_MaxDirectoryDepth) {
        filename2.replace(slash, 1, "_");
        slash = static_cast<long int>(filename2.find_last_of("/"));
        i++;
      }
    slash = static_cast<long int>(filename2.find_last_of("/"));
    if(slash != -1)
      {
      filename2 = filename2.substr(slash+1,filename2.size()-slash-1);
      }
    filename += filename2;

    filename += ".html";

    file.open(filename.c_str(), std::ios::binary | std::ios::out);
    if(!file.is_open())
      {
      std::cout << "Cannot open file for writing: " <<  std::endl;
      return false;
      }

    this->CreateHeader(&file,filename.c_str());

    file << R"(<table width="100%" border="0" height="1">)" << std::endl;

    // To speedup the process we list the lines that have errors
    using ErrorLineType = std::pair<long, std::vector<long>>;
    std::vector<ErrorLineType> errorLines;

    const Parser::ErrorVectorType errors = (*it).GetErrors();
    auto itError = errors.begin();
    while (itError != errors.end()) {
      for (unsigned long index = (*itError).line; index <= (*itError).line2;
           index++) {
        ErrorLineType errLine;
        errLine.first = index;

        // Check if the line already exists
        auto errorLineIt = errorLines.begin();
        while (errorLineIt != errorLines.end()) {
          if ((*errorLineIt).first == static_cast<int>(index)) {
            break;
          }
          errorLineIt++;
        }

        if (errorLineIt != errorLines.end()) {
          (*errorLineIt).second.push_back((*itError).number);
        } else {
          errLine.second.push_back((*itError).number);
          errorLines.push_back(errLine);
        }
      }
      itError++;
     }

    bool comment = false;
    unsigned long nLines = (*it).GetNumberOfLines();
    for(i=0;i<nLines;i++)
      {
      // Look in the errors if there is a match for this line
      long error = -1;
      std::string errorTag = "";

      std::vector<ErrorLineType>::const_iterator errorLineIt = errorLines.begin();
      while(errorLineIt != errorLines.end())
        {
        if((*errorLineIt).first == static_cast<int>(i+1))
          {
          auto err = (*errorLineIt).second.begin();
          while(err != (*errorLineIt).second.end())
            {
            error = *err;
            if (errorTag.empty()) {
              errorTag += (*it).GetErrorTag(error);
            } else {
              errorTag += ",";
              errorTag += (*it).GetErrorTag(error);
            }
             err++;
             }
           break;
           }
         errorLineIt++;
         }

      if(error>=0)
        {
        file << "<tr bgcolor=\"" << ErrorColor[error]  << "\">" << std::endl;
        }
      else
        {
        file << "<tr>" << std::endl;
        }

      // First column is the line number
      file << "<td height=\"1\">" << i+1 << "</td>" << std::endl;

      // Second column is the error tag
      file << "<td height=\"1\">" << errorTag.c_str() << "</td>" << std::endl;

      std::string l = (*it).GetLine(i);

      // If the error is of type INDENT we show the problem as *
      if(errorTag.find("IND") != std::string::npos)
        {
        unsigned int k = 0;
        while((l[k] == ' ') || (l[k] == '\n'))
          {
          if(l[k] == ' ')
            {
            l[k]='*';
            }
          k++;
          }
        }

      // If the error is of type extra spaces we show the problem as *
      if(errorTag.find("ESP") != std::string::npos)
        {
        int k = static_cast<int>(l.size())-1;
        while(k>0 && (l[k] == ' '))
          {
          l[k]='*';
          k--;
          }
        }

      // Remove the first \n
        auto p = static_cast<long int>(l.find('\n'));
        if (p != -1) {
          l.replace(p, 1, "");
        }

      // Replace < and >
        auto inf = static_cast<long int>(l.find("<", 0));
        while (inf != -1) {
          l.replace(inf, 1, "&lt;");
          inf = static_cast<long int>(l.find("<", 0));
        }

        auto sup = static_cast<long int>(l.find(">", 0));
        while (sup != -1) {
          l.replace(sup, 1, "&gt;");
          sup = static_cast<long int>(l.find(">", 0));
        }

      // Replace the space by &nbsp;
        auto space = static_cast<long int>(l.find(' ', 0));
        while (space != -1) {
          l.replace(space, 1, "&nbsp;");
          space = static_cast<long int>(l.find(' ', space + 1));
        }

      // Show the comments in green
      if(comment)
        {
        l.insert(0,"<font color=\"#009933\">");
        }

      // Show the comments in green
      space = static_cast<long int>(l.find("//",0));
      if(space != -1)
        {
        l.insert(space,"<font color=\"#009933\">");
        l += "<font>";
        }
      else
        {
        space = static_cast<long int>(l.find("/*",0));
        while(space != -1)
          {
          comment = true;
          l.insert(space,"<font color=\"#009933\">");
          space = static_cast<long int>(l.find("/*",space+23));
          }

        if(comment)
          {
          l.insert(l.size(),"</font>");
          }

        space = static_cast<long int>(l.find("*/",0));

        while(space != -1)
          {
          comment = false;
          l.insert(space+2,"</font>");
          space = static_cast<long int>(l.find("*/",space+8));
          }
        }
        file
            << R"(<td height="1"><font face="Courier New, Courier, mono" size="2">)"
            << l.c_str() << "</font></td>" << std::endl;
        file << "</tr>" << std::endl;
      }

    file << "</table>" << std::endl;

    this->CreateFooter(&file);

    file.close();
    it++;
    }

  std::cout << "done" << std::endl;
  return true;
}